

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastGdS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  int v1;
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  uint *puVar6;
  MessageLite **ppMVar7;
  TcParseTableBase *pTVar8;
  MessageLite *pMVar9;
  ulong uVar10;
  string *psVar11;
  ushort *puVar12;
  char *pcVar13;
  ushort *puVar14;
  size_type sVar15;
  undefined8 uVar16;
  int iVar17;
  Arena *arena;
  pointer pcVar18;
  ushort *local_40 [2];
  
  if (data.field_0._0_1_ != '\0') {
    pcVar13 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar13;
  }
  bVar3 = *ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar6 = *puVar6 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  ppMVar7 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)data.field_0 >> 0x30);
  pTVar8 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  pMVar9 = *ppMVar7;
  if (pMVar9 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar9 = ClassData::New(pTVar8->class_data,arena);
    *ppMVar7 = pMVar9;
  }
  iVar17 = ctx->depth_;
  v1 = iVar17 + -1;
  ctx->depth_ = v1;
  if (iVar17 < 1) {
    puVar12 = (ushort *)0x0;
  }
  else {
    local_40[0] = (ushort *)(ptr + 1);
    iVar17 = ctx->group_depth_ + 1;
    ctx->group_depth_ = iVar17;
    while (bVar4 = ParseContext::Done(ctx,(char **)local_40), !bVar4) {
      uVar5 = (uint)pTVar8->fast_idx_mask & (uint)*local_40[0];
      if ((uVar5 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar10 = (ulong)(uVar5 & 0xfffffff8);
      local_40[0] = (ushort *)
                    (**(code **)(&pTVar8[1].has_bits_offset + uVar10))
                              (pMVar9,local_40[0],ctx,
                               (ulong)*local_40[0] ^
                               *(ulong *)(&pTVar8[1].fast_idx_mask + uVar10 * 2),pTVar8,0);
      if ((local_40[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)
         ) break;
    }
    puVar14 = local_40[0];
    if ((pTVar8->field_0x9 & 1) != 0) {
      puVar14 = (ushort *)(*pTVar8->post_loop_handler)(pMVar9,(char *)local_40[0],ctx);
    }
    if (puVar14 != (ushort *)0x0) {
      psVar11 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                          (v1,ctx->depth_,"old_depth == depth_");
      if (psVar11 != (string *)0x0) {
        pcVar18 = (psVar11->_M_dataplus)._M_p;
        sVar15 = psVar11->_M_string_length;
        uVar16 = 0x45b;
LAB_0014349e:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar16,sVar15,pcVar18);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_40);
      }
      psVar11 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                          (iVar17,ctx->group_depth_,"old_group_depth == group_depth_");
      if (psVar11 != (string *)0x0) {
        pcVar18 = (psVar11->_M_dataplus)._M_p;
        sVar15 = psVar11->_M_string_length;
        uVar16 = 0x45c;
        goto LAB_0014349e;
      }
    }
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    uVar5 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar12 = (ushort *)0x0;
    if (uVar5 == bVar3) {
      puVar12 = puVar14;
    }
  }
  return (char *)puVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}